

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instimpl.cpp
# Opt level: O1

Error asmjit::X86InstImpl::validate
                (uint32_t archType,Detail *detail,Operand_ *operands,uint32_t count)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Error EVar10;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  byte *pbVar14;
  uint uVar15;
  undefined1 *puVar16;
  Error EVar17;
  uint uVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  Operand_ *pOVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  OSignature oSigTranslated [6];
  uint local_b8;
  Operand_ *local_b0;
  uint uStack_68;
  ushort uStack_64;
  byte abStack_61 [49];
  
  EVar17 = 5;
  if (2 < archType - 1) {
    return 5;
  }
  puVar16 = _x86ValidationData;
  if (archType != 1) {
    puVar16 = _x64ValidationData;
  }
  if (0x59b < (ulong)detail->instId) {
    return 3;
  }
  uVar2 = detail->options;
  uVar11 = *(uint *)(X86InstDB::instData + (ulong)detail->instId * 0xc);
  uVar3 = *(uint *)(X86InstDB::commonData + (ulong)(uVar11 >> 0x16) * 0xc);
  if ((uVar2 & 0x32000) != 0) {
    if ((uVar2 >> 0xd & 1) != 0) {
      EVar17 = 0x1c;
      if (count == 0) {
        return 0x1c;
      }
      if ((uVar2 & 0x30000) == 0 && (uVar3 & 0x4000) == 0) {
        return 0x1c;
      }
      if (((operands->field_0)._any.signature & 7) != 2) {
        return 0x1c;
      }
    }
    if ((uVar2 & 0x30000) != 0) {
      EVar17 = 0x1b;
      if ((uVar2 >> 0xd & 1) == 0) {
        return 0x1b;
      }
      if ((uVar2 & 0x30000) == 0x30000) {
        return 0x1b;
      }
      if (((uVar2 >> 0x10 & 1) != 0) && ((uVar3 & 0x8000) == 0)) {
        return 0x1d;
      }
      if (((uVar2 >> 0x11 & 1) != 0) && ((uVar3 & 0x10000) == 0)) {
        return 0x1e;
      }
    }
  }
  uVar7 = uVar2 & 0xc000;
  if (uVar7 != 0) {
    if (uVar7 == 0xc000) {
      return 0x1b;
    }
    EVar17 = 0x1f;
    if (((uVar2 >> 0xe & 1) != 0) && ((uVar3 & 0x1000) == 0)) {
      return 0x1f;
    }
    if (((short)uVar2 < 0) && ((uVar3 & 0x2000) == 0)) {
      return 0x1f;
    }
  }
  bVar30 = count != 0;
  if (count == 0) {
    uVar18 = 0;
    local_b0 = (Operand_ *)0x0;
    bVar31 = false;
    uVar28 = 0;
  }
  else {
    uVar27 = (ulong)count;
    uVar18 = 0x4032;
    if (archType != 1) {
      uVar18 = 0x4062;
    }
    uVar22 = 0xe30;
    if (archType != 1) {
      uVar22 = 0xe60;
    }
    uVar12 = 0;
    uVar28 = 0;
    local_b8 = 0;
    local_b0 = (Operand_ *)0x0;
    pOVar24 = operands;
    do {
      uVar26 = (pOVar24->field_0)._any.signature;
      switch(uVar26 & 7) {
      case 0:
        iVar23 = 2;
        break;
      case 1:
        uVar26 = uVar26 >> 3 & 0x1f;
        iVar23 = 1;
        uVar13 = 0;
        if ((uVar26 < 0x16) &&
           (uVar15 = *(uint *)(_x86OpFlagFromRegType + (ulong)uVar26 * 4), uVar15 != 0)) {
          uVar8 = (pOVar24->field_0)._any.id;
          bVar31 = true;
          uVar21 = 0xffffffff;
          if (uVar8 < 0x100) {
            if (uVar8 < 0x20) {
              uVar21 = 1 << (uVar8 & 0x1f);
              if ((*(uint *)(puVar16 + (ulong)uVar26 * 4) >> (uVar8 & 0x1f) & 1) != 0) {
                local_b8 = local_b8 | uVar21;
                goto LAB_0016b975;
              }
            }
            else {
              uVar21 = 0;
            }
            bVar20 = (byte)uVar21;
            bVar31 = false;
            EVar17 = 0x19;
          }
          else {
LAB_0016b975:
            bVar20 = (byte)uVar21;
            iVar23 = 5;
          }
        }
        else {
          bVar20 = 0;
          uVar15 = 0;
          bVar31 = false;
          EVar17 = 0x17;
          iVar23 = 1;
        }
        if (!bVar31) break;
        goto LAB_0016ba63;
      case 2:
        iVar23 = 1;
        if ((~uVar26 & 0xe00000) == 0) {
          EVar17 = 0x2b;
          bVar20 = 0;
          uVar13 = 0;
          uVar15 = 0;
          bVar31 = false;
        }
        else {
          uVar8 = uVar26 >> 3 & 0x1f;
          uVar15 = uVar26 >> 8 & 0x1f;
          if (uVar8 == 0) {
            bVar31 = 2 < (pOVar24->field_0)._mem.field_2.offset64 + 0x80000000 >> 0x1f;
            if (bVar31 && archType == 1) {
              EVar17 = 0x26;
            }
            bVar20 = 0;
            uVar13 = 0;
            if (!bVar31 || archType != 1) goto LAB_0016bad2;
            uVar13 = 0;
          }
          else {
            uVar21 = (pOVar24->field_0)._any.reserved12_4;
            if (((uVar26 >> 0x10 & 1) == 0) && ((uVar18 >> (uVar26 >> 3 & 0x1f) & 1) == 0)) {
              EVar17 = 0x26;
              bVar20 = 0;
              uVar13 = 0;
              bVar31 = false;
            }
            else {
              bVar20 = 0xff;
              if (uVar21 < 0x100) {
                if (0x1f < uVar21) {
                  validate();
                  return 0x21;
                }
                bVar20 = (byte)(1 << (uVar21 & 0x1f));
                local_b8 = local_b8 | 1 << (uVar21 & 0x1f);
              }
              bVar31 = true;
              uVar13 = 0;
              if (uVar15 == 0) {
                uVar13 = (ushort)((pOVar24->field_0)._any.reserved8_4 == 0) << 0xb;
              }
            }
            if (bVar31) {
LAB_0016bad2:
              if (uVar15 == 0) {
                uVar15 = 0x10000;
              }
              else {
                if ((uVar22 >> (uVar26 >> 8 & 0x1f) & 1) == 0) {
                  EVar17 = 0x26;
                  goto LAB_0016bafe;
                }
                if (uVar15 == 0xb) {
                  uVar13 = uVar13 | 0x44;
LAB_0016bb21:
                  uVar15 = 0x20000;
                  bVar5 = 0;
                }
                else {
                  if (uVar15 == 10) {
                    uVar13 = uVar13 | 0x22;
                    goto LAB_0016bb21;
                  }
                  if (uVar15 == 9) {
                    uVar13 = uVar13 | 0x11;
                    goto LAB_0016bb21;
                  }
                  uVar6 = uVar13 + 0x4000;
                  if (uVar8 == 0) {
                    uVar6 = uVar13;
                  }
                  uVar13 = uVar6;
                  uVar15 = 0x10000;
                  bVar5 = 1;
                }
                bVar31 = false;
                if ((bool)(uVar8 == 0xe & (bVar5 ^ 1))) {
                  EVar17 = 0x26;
                  goto LAB_0016bbee;
                }
                uVar8 = (pOVar24->field_0)._any.id;
                if (uVar8 < 0x100) {
                  if (0x1f < uVar8) {
                    validate();
                    goto LAB_0016c13e;
                  }
                  local_b8 = local_b8 | 1 << (uVar8 & 0x1f);
                }
                bVar20 = 0;
              }
              uVar26 = uVar26 >> 0x18;
              bVar31 = false;
              switch(uVar26) {
              case 0:
                uVar13 = uVar13 | 0x8000;
                break;
              case 1:
                uVar13 = uVar13 | 1;
                break;
              case 2:
                uVar13 = uVar13 | 2;
                break;
              case 3:
              case 5:
              case 7:
              case 9:
              case 0xb:
              case 0xc:
              case 0xd:
              case 0xe:
              case 0xf:
switchD_0016bb8f_caseD_3:
                EVar17 = 0x2d;
                goto LAB_0016bbee;
              case 4:
                uVar13 = uVar13 | 4;
                break;
              case 6:
                uVar13 = uVar13 | 8;
                break;
              case 8:
                uVar13 = uVar13 | 0x10;
                break;
              case 10:
                uVar13 = uVar13 | 0x20;
                break;
              case 0x10:
                uVar13 = uVar13 | 0x40;
                break;
              default:
                if (uVar26 == 0x20) {
                  uVar13 = uVar13 | 0x80;
                }
                else {
                  if (uVar26 != 0x40) goto switchD_0016bb8f_caseD_3;
                  uVar13 = uVar13 | 0x100;
                }
              }
              iVar23 = 5;
              bVar31 = true;
              goto LAB_0016bbee;
            }
          }
LAB_0016bafe:
          uVar15 = 0;
          bVar31 = false;
        }
LAB_0016bbee:
        local_b0 = pOVar24;
        if (bVar31) goto LAB_0016ba63;
        break;
      case 3:
        uVar9 = *(ulong *)((long)&pOVar24->field_0 + 8);
        if ((long)uVar9 < 0) {
          uVar9 = -uVar9;
          uVar15 = 0x2a80000;
          if ((0x80 < uVar9) && (uVar15 = 0x2a00000, 0x8000 < uVar9)) {
            uVar15 = (uVar9 < 0x80000001 | 4) << 0x17;
          }
        }
        else {
          uVar15 = 0x7fc0000;
          if (((((0xf < uVar9) && (uVar15 = 0x7f80000, 0x7f < uVar9)) &&
               (uVar15 = 0x7f00000, 0xff < uVar9)) &&
              ((uVar15 = 0x7e00000, 0x7fff < uVar9 && (uVar15 = 0x7c00000, 0xffff < uVar9)))) &&
             (uVar15 = 0x7800000, uVar9 >> 0x1f != 0)) {
            uVar15 = (uVar9 >> 0x20 == 0 | 6) << 0x18;
          }
        }
        goto LAB_0016ba5e;
      case 4:
        uVar15 = 0x18000000;
LAB_0016ba5e:
        bVar20 = 0;
        uVar13 = 0;
LAB_0016ba63:
        (&uStack_68)[uVar12 * 2] = uVar15;
        (&uStack_64)[uVar12 * 4] = uVar13;
        abStack_61[uVar12 * 8] = bVar20;
        uVar28 = uVar28 | uVar15;
        iVar23 = 0;
        break;
      default:
        EVar17 = 4;
        iVar23 = 1;
      }
      if (iVar23 != 0) {
        uVar27 = uVar12;
        if (iVar23 != 2) {
          return EVar17;
        }
        break;
      }
      uVar12 = uVar12 + 1;
      bVar30 = uVar12 < uVar27;
      pOVar24 = pOVar24 + 1;
    } while (uVar27 != uVar12);
    uVar18 = (uint)uVar27;
    bVar31 = 0xff < local_b8;
  }
  if (bVar30) {
    uVar22 = count - 1;
    count = uVar22;
    if (uVar18 < uVar22) {
      count = uVar18;
    }
    while (uVar18 < uVar22) {
      uVar27 = (ulong)uVar22;
      uVar22 = uVar22 - 1;
      if ((undefined1  [16])((undefined1  [16])operands[uVar27].field_0 & (undefined1  [16])0x7) !=
          (undefined1  [16])0x0) {
        return 4;
      }
    }
  }
  if (archType == 1) {
    if ((uVar28 & 0x10) != 0) {
      return 0x32;
    }
  }
  else if (((byte)((uVar28 & 2) >> 1) & bVar31) != 0) {
    return 0x31;
  }
  uVar12 = (ulong)count;
  uVar27 = *(ulong *)(X86InstDB::commonData + (ulong)(uVar11 >> 0x16) * 0xc + 4) >> 0x32;
  if ((uVar27 & 0xf) != 0) {
    pbVar14 = X86InstDB::iSignatureData +
              (ulong)((uint)(*(ulong *)(X86InstDB::commonData + (ulong)(uVar11 >> 0x16) * 0xc + 4)
                            >> 0x28) & 0x3ff) * 8;
    pbVar1 = pbVar14 + (uVar27 & 0xf) * 8;
    bVar30 = false;
    do {
      bVar20 = *pbVar14;
      if ((byte)(bVar20 >> 3 & (archType != 1) + 1U) != 0) {
        uVar11 = bVar20 & 7;
        if (count == uVar11) {
          if (uVar12 == 0) {
LAB_0016bf0e:
            bVar31 = false;
            uVar27 = 0;
          }
          else {
            uVar27 = 0;
            bVar31 = false;
            do {
              uVar9 = (ulong)pbVar14[uVar27 + 2];
              uVar11 = (&uStack_68)[uVar27 * 2];
              if ((*(uint *)(X86InstDB::oSignatureData + uVar9 * 8) & uVar11) == 0) {
                bVar32 = (uVar11 & 0x7fc0000) != 0;
                bVar33 = (*(uint *)(X86InstDB::oSignatureData + uVar9 * 8) & 0x7fc0000) != 0;
                bVar4 = bVar33 && bVar32;
                if (bVar33 && bVar32) {
                  bVar31 = true;
                }
              }
              else {
                uVar13 = (&uStack_64)[uVar27 * 4];
                if (((uVar13 != 0) &&
                    (((*(ushort *)(X86InstDB::oSignatureData + uVar9 * 8 + 4) & uVar13) == 0 ||
                     (((uVar13 >> 0xb & 1) == 0 &&
                      ((*(ushort *)(X86InstDB::oSignatureData + uVar9 * 8 + 4) & 0x800) != 0))))))
                   || ((bVar4 = true, (uVar11 & 0x7fff) != 0 &&
                       ((X86InstDB::oSignatureData[uVar9 * 8 + 7] != 0 &&
                        ((abStack_61[uVar27 * 8] & X86InstDB::oSignatureData[uVar9 * 8 + 7]) == 0)))
                       ))) {
                  bVar4 = false;
                }
              }
              if (!bVar4) goto LAB_0016bf16;
              uVar27 = uVar27 + 1;
            } while (uVar12 != uVar27);
            uVar27 = (ulong)count;
          }
        }
        else {
          bVar31 = false;
          if ((uVar11 - (bVar20 >> 5) != count) || (count == 0)) goto LAB_0016bf0e;
          uVar27 = 0;
          if ((char)uVar11 != '\0') {
            uVar29 = 0;
            uVar9 = 0;
            uVar27 = 0;
            bVar31 = false;
            bVar4 = false;
            do {
              uVar18 = (int)uVar9 + 1;
              uVar19 = (ulong)uVar18;
              if (uVar18 <= uVar11) {
                uVar19 = (ulong)uVar11;
              }
              do {
                uVar25 = (ulong)pbVar14[uVar9 + 2];
                uVar18 = *(uint *)(X86InstDB::oSignatureData + uVar25 * 8);
                if (-1 < (int)uVar18) {
                  uVar28 = (&uStack_68)[uVar29 * 2];
                  if ((uVar28 & uVar18) == 0) {
                    bVar33 = (uVar28 & 0x7fc0000) != 0;
                    bVar34 = (uVar18 & 0x7fc0000) != 0;
                    bVar32 = bVar34 && bVar33;
                    bVar31 = bVar4;
                    if (bVar34 && bVar33) {
                      bVar31 = true;
                      bVar4 = bVar31;
                    }
                  }
                  else {
                    uVar13 = (&uStack_64)[uVar29 * 4];
                    if ((uVar13 == 0) ||
                       (((*(ushort *)(X86InstDB::oSignatureData + uVar25 * 8 + 4) & uVar13) != 0 &&
                        (((uVar13 >> 0xb & 1) != 0 ||
                         ((*(ushort *)(X86InstDB::oSignatureData + uVar25 * 8 + 4) & 0x800) == 0))))
                       )) {
                      bVar32 = true;
                      if (((uVar28 & 0x7fff) != 0) &&
                         ((bVar32 = true, X86InstDB::oSignatureData[uVar25 * 8 + 7] != 0 &&
                          ((abStack_61[uVar29 * 8] & X86InstDB::oSignatureData[uVar25 * 8 + 7]) == 0
                          )))) {
                        bVar32 = false;
                      }
                    }
                    else {
                      bVar32 = false;
                    }
                  }
                  goto LAB_0016beef;
                }
                uVar18 = (int)uVar9 + 1;
                uVar9 = (ulong)uVar18;
              } while (uVar18 < uVar11);
              uVar9 = uVar19;
              bVar32 = false;
LAB_0016beef:
              if (!bVar32) {
                uVar27 = uVar29 & 0xffffffff;
                break;
              }
              uVar29 = uVar29 + 1;
              uVar27 = (ulong)((int)uVar27 + 1);
              if ((uVar12 <= uVar29) ||
                 (uVar18 = (int)uVar9 + 1, uVar9 = (ulong)uVar18, uVar11 <= uVar18)) break;
            } while( true );
          }
        }
LAB_0016bf16:
        if (((uint)uVar27 == count) && (bVar30 = bVar31, !bVar31)) break;
      }
      bVar31 = bVar30;
      pbVar14 = pbVar14 + 8;
      bVar30 = bVar31;
    } while (pbVar14 != pbVar1);
    EVar10 = 0x16;
    if (bVar31) {
      EVar10 = 0x2c;
    }
    if (pbVar14 == pbVar1) {
      return EVar10;
    }
  }
  uVar11 = (detail->extraReg)._signature;
  if ((uVar2 & 0x9c0000) != 0 || uVar11 != 0) {
    if ((uVar3 >> 0x14 & 1) == 0) {
      EVar17 = 0;
      if (uVar7 == 0) {
        EVar17 = 0x16;
      }
      if ((uVar2 & 0x9c0000) != 0) {
        return 0x16;
      }
      return EVar17;
    }
    if (uVar11 != 0) {
      if ((uVar11 & 0xf8) != 0x90) {
        return 0x21;
      }
      if ((uVar3 >> 0x18 & 1) == 0) {
        return 0x22;
      }
    }
    if (((uVar2 >> 0x17 & 1) != 0) && ((uVar3 & 0x2000000) == 0)) {
      return 0x23;
    }
    if ((uVar2 >> 0x14 & 1) != 0) {
      if (local_b0 == (Operand_ *)0x0) {
        return 0x24;
      }
      uVar11 = (local_b0->field_0)._any.signature;
      bVar30 = true;
      if ((0xffffff < uVar11) &&
         (((uVar11 = uVar11 >> 0x18, (uVar3 >> 0x1c & 1) != 0 && (uVar11 != 4)) ||
          (((uVar3 >> 0x1d & 1) != 0 && (uVar11 != 8)))))) {
        bVar30 = false;
        EVar17 = 0x24;
      }
      if (!bVar30) {
        return EVar17;
      }
    }
    if ((uVar2 & 0xc0000) != 0) {
      if (local_b0 != (Operand_ *)0x0) {
        return 0x25;
      }
      if ((uVar2 >> 0x12 & 1) == 0) {
        if ((uVar3 >> 0x1b & 1) == 0) {
          return 0x25;
        }
        return 0;
      }
      if ((uVar3 >> 0x1a & 1) == 0) {
        return 0x25;
      }
      if ((uVar3 & 0x30000000) != 0) {
        if (count < 2) {
LAB_0016c13e:
          validate();
        }
        if ((operands->field_0)._any.signature != 0x40000159) {
          if (operands[1].field_0._any.signature != 0x40000159) {
            return 0x25;
          }
          return 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86InstImpl::validate(uint32_t archType, const Inst::Detail& detail, const Operand_* operands, uint32_t count) noexcept {
  uint32_t i;
  uint32_t archMask;
  const X86ValidationData* vd;

  if (!ArchInfo::isX86Family(archType))
    return DebugUtils::errored(kErrorInvalidArch);

  if (archType == ArchInfo::kTypeX86) {
    vd = &_x86ValidationData;
    archMask = X86Inst::kArchMaskX86;
  }
  else {
    vd = &_x64ValidationData;
    archMask = X86Inst::kArchMaskX64;
  }

  // Get the instruction data.
  uint32_t instId = detail.instId;
  uint32_t options = detail.options;

  if (ASMJIT_UNLIKELY(instId >= X86Inst::_kIdCount))
    return DebugUtils::errored(kErrorInvalidArgument);

  const X86Inst* iData = &X86InstDB::instData[instId];
  uint32_t iFlags = iData->getFlags();

  // Validate LOCK, XACQUIRE, and XRELEASE prefixes.
  const uint32_t kLockXAcqRel = X86Inst::kOptionXAcquire | X86Inst::kOptionXRelease;
  if (options & (X86Inst::kOptionLock | kLockXAcqRel)) {
    if (options & X86Inst::kOptionLock) {
      if (ASMJIT_UNLIKELY(!(iFlags & X86Inst::kFlagLock) && !(options & kLockXAcqRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(count < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (options & kLockXAcqRel) {
      if (ASMJIT_UNLIKELY(!(options & X86Inst::kOptionLock) || (options & kLockXAcqRel) == kLockXAcqRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXAcquire) && !(iFlags & X86Inst::kFlagXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY((options & X86Inst::kOptionXRelease) && !(iFlags & X86Inst::kFlagXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNZ prefixes.
  const uint32_t kRepRepRepnz = X86Inst::kOptionRep | X86Inst::kOptionRepnz;
  if (options & kRepRepRepnz) {
    if (ASMJIT_UNLIKELY((options & kRepRepRepnz) == kRepRepRepnz))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRep) && !(iFlags & X86Inst::kFlagRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    if (ASMJIT_UNLIKELY((options & X86Inst::kOptionRepnz) && !(iFlags & X86Inst::kFlagRepnz)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);

    // TODO: Validate extraReg {cx|ecx|rcx}.
  }

  // Translate the given operands to `X86Inst::OSignature`.
  X86Inst::OSignature oSigTranslated[6];
  uint32_t combinedOpFlags = 0;
  uint32_t combinedRegMask = 0;

  const X86Mem* memOp = nullptr;

  for (i = 0; i < count; i++) {
    const Operand_& op = operands[i];
    if (op.getOp() == Operand::kOpNone) break;

    uint32_t opFlags = 0;
    uint32_t memFlags = 0;
    uint32_t regMask = 0;

    switch (op.getOp()) {
      case Operand::kOpReg: {
        uint32_t regType = op.as<Reg>().getType();
        if (ASMJIT_UNLIKELY(regType >= X86Reg::kRegCount))
          return DebugUtils::errored(kErrorInvalidRegType);

        opFlags = _x86OpFlagFromRegType[regType];
        if (ASMJIT_UNLIKELY(opFlags == 0))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kPackedIdMin it means
        // that the register is virtual and its index will be assigned later
        // by the register allocator. We must pass unless asked to disallow
        // virtual registers.
        // TODO: We need an option to refuse virtual regs here.
        uint32_t regId = op.getId();
        if (regId < Operand::kPackedIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Utils::mask(regId);
          if (ASMJIT_UNLIKELY((vd->allowedRegMask[regType] & regMask) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          combinedRegMask |= regMask;
        }
        else {
          regMask = 0xFFFFFFFFU;
        }
        break;
      }

      // TODO: Validate base and index and combine with `combinedRegMask`.
      case Operand::kOpMem: {
        const X86Mem& m = op.as<X86Mem>();

        uint32_t baseType = m.getBaseType();
        uint32_t indexType = m.getIndexType();

        memOp = &m;

        if (m.getSegmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        if (baseType) {
          uint32_t baseId = m.getBaseId();

          if (m.isRegHome()) {
            // Home address of virtual register. In such case we don't want to
            // validate the type of the base register as it will always be patched
            // to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY((vd->allowedMemBaseRegs & (1U << baseType)) == 0))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit
          // memory operand. Basically only usable for string instructions and other
          // instructions where memory operand is implicit and has 'seg:[reg]' form.
          if (baseId < Operand::kPackedIdMin) {
            // Physical base id.
            regMask = Utils::mask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - will the whole mask for implicit mem validation.
            // The register is not assigned yet, so we cannot predict the phys id.
            regMask = 0xFFFFFFFFU;
          }

          if (!indexType && !m.getOffsetLo32())
            memFlags |= X86Inst::kMemOpBaseOnly;
        }
        else {
          // Base is an address, make sure that the address doesn't overflow 32-bit
          // integer (either int32_t or uint32_t) in 32-bit targets.
          int64_t offset = m.getOffset();
          if (archMask == X86Inst::kArchMaskX86 && !Utils::isInt32(offset) && !Utils::isUInt32(offset))
            return DebugUtils::errored(kErrorInvalidAddress);
        }

        if (indexType) {
          if (ASMJIT_UNLIKELY((vd->allowedMemIndexRegs & (1U << indexType)) == 0))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == X86Reg::kRegXmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32x | X86Inst::kMemOpVm64x;
          }
          else if (indexType == X86Reg::kRegYmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32y | X86Inst::kMemOpVm64y;
          }
          else if (indexType == X86Reg::kRegZmm) {
            opFlags |= X86Inst::kOpVm;
            memFlags |= X86Inst::kMemOpVm32z | X86Inst::kMemOpVm64z;
          }
          else {
            opFlags |= X86Inst::kOpMem;
            if (baseType)
              memFlags |= X86Inst::kMemOpMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == X86Reg::kRegRip && (opFlags & X86Inst::kOpVm))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.getIndexId();
          if (indexId < Operand::kPackedIdMin)
            combinedRegMask |= Utils::mask(indexId);

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }
        else {
          opFlags |= X86Inst::kOpMem;
        }

        switch (m.getSize()) {
          case  0: memFlags |= X86Inst::kMemOpAny ; break;
          case  1: memFlags |= X86Inst::kMemOpM8  ; break;
          case  2: memFlags |= X86Inst::kMemOpM16 ; break;
          case  4: memFlags |= X86Inst::kMemOpM32 ; break;
          case  6: memFlags |= X86Inst::kMemOpM48 ; break;
          case  8: memFlags |= X86Inst::kMemOpM64 ; break;
          case 10: memFlags |= X86Inst::kMemOpM80 ; break;
          case 16: memFlags |= X86Inst::kMemOpM128; break;
          case 32: memFlags |= X86Inst::kMemOpM256; break;
          case 64: memFlags |= X86Inst::kMemOpM512; break;
          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case Operand::kOpImm: {
        uint64_t immValue = op.as<Imm>().getUInt64();
        uint32_t immFlags = 0;

        if (static_cast<int64_t>(immValue) >= 0) {
          const uint32_t k32AndMore = X86Inst::kOpI32 | X86Inst::kOpU32 |
                                      X86Inst::kOpI64 | X86Inst::kOpU64 ;

          if (immValue <= 0xFU)
            immFlags = X86Inst::kOpU4 | X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FU)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFU)
            immFlags = X86Inst::kOpU8 | X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFU)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0xFFFFU)
            immFlags = X86Inst::kOpU16 | k32AndMore;
          else if (immValue <= 0x7FFFFFFFU)
            immFlags = k32AndMore;
          else if (immValue <= 0xFFFFFFFFU)
            immFlags = X86Inst::kOpU32 | X86Inst::kOpI64 | X86Inst::kOpU64;
          else if (immValue <= ASMJIT_UINT64_C(0x7FFFFFFFFFFFFFFF))
            immFlags = X86Inst::kOpI64 | X86Inst::kOpU64;
          else
            immFlags = X86Inst::kOpU64;
        }
        else {
          // 2s complement negation, as our number is unsigned...
          immValue = (~immValue + 1);

          if (immValue <= 0x80U)
            immFlags = X86Inst::kOpI8 | X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x8000U)
            immFlags = X86Inst::kOpI16 | X86Inst::kOpI32 | X86Inst::kOpI64;
          else if (immValue <= 0x80000000U)
            immFlags = X86Inst::kOpI32 | X86Inst::kOpI64;
          else
            immFlags = X86Inst::kOpI64;
        }
        opFlags |= immFlags;
        break;
      }

      case Operand::kOpLabel: {
        opFlags |= X86Inst::kOpRel8 | X86Inst::kOpRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    X86Inst::OSignature& tod = oSigTranslated[i];
    tod.flags = opFlags;
    tod.memFlags = static_cast<uint16_t>(memFlags);
    tod.regMask = static_cast<uint8_t>(regMask & 0xFFU);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important
  // as Assembler and CodeCompiler may just pass more operands where some of
  // them are none (it means that no operand is given at that index). However,
  // validate that there are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < count) {
    while (--count > i)
      if (ASMJIT_UNLIKELY(!operands[count].isNone()))
        return DebugUtils::errored(kErrorInvalidState);
  }

  // Validate X86 and X64 specific cases.
  if (archMask == X86Inst::kArchMaskX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpq) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    if (ASMJIT_UNLIKELY((combinedOpFlags & X86Inst::kOpGpbHi) != 0 && (combinedRegMask & 0xFFFFFF00U) != 0))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate instruction operands.
  const X86Inst::CommonData* commonData = &iData->getCommonData();
  const X86Inst::ISignature* iSig = X86InstDB::iSignatureData + commonData->_iSignatureIndex;
  const X86Inst::ISignature* iEnd = iSig                      + commonData->_iSignatureCount;

  if (iSig != iEnd) {
    const X86Inst::OSignature* oSigData = X86InstDB::oSignatureData;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if ((iSig->archMask & archMask) == 0) continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount;
      bool localImmOutOfRange = false;

      if (iSigCount == count) {
        for (j = 0; j < count; j++)
          if (!x86CheckOSig(oSigTranslated[j], oSigData[iSig->operands[j]], localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicit == count) {
        uint32_t r = 0;
        for (j = 0; j < count && r < iSigCount; j++, r++) {
          const X86Inst::OSignature* oChk = oSigTranslated + j;
          const X86Inst::OSignature* oRef;
Next:
          oRef = oSigData + iSig->operands[r];
          // Skip implicit.
          if ((oRef->flags & X86Inst::kOpImplicit) != 0) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == count) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX-512 options:
  const RegOnly& extraReg = detail.extraReg;
  const uint32_t kAvx512Options = X86Inst::kOptionZMask   |
                                  X86Inst::kOption1ToX    |
                                  X86Inst::kOptionER      |
                                  X86Inst::kOptionSAE     ;

  if (!extraReg.isNone() || (options & kAvx512Options)) {
    if (commonData->hasFlag(X86Inst::kFlagEvex)) {
      // Validate AVX-512 {k} and {k}{z}.
      if (!extraReg.isNone()) {
        // Mask can only be specified by a 'k' register.
        if (ASMJIT_UNLIKELY(extraReg.getType() != X86Reg::kRegK))
          return DebugUtils::errored(kErrorInvalidKMaskReg);

        if (ASMJIT_UNLIKELY(!commonData->hasAvx512K()))
          return DebugUtils::errored(kErrorInvalidKMaskUse);
      }

      if ((options & X86Inst::kOptionZMask)) {
        if (ASMJIT_UNLIKELY((options & X86Inst::kOptionZMask) != 0 && !commonData->hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 broadcast {1tox}.
      if (options & X86Inst::kOption1ToX) {
        if (ASMJIT_UNLIKELY(!memOp))
          return DebugUtils::errored(kErrorInvalidBroadcast);

        uint32_t size = memOp->getSize();
        if (size != 0) {
          // The the size is specified it has to match the broadcast size.
          if (ASMJIT_UNLIKELY(commonData->hasAvx512B32() && size != 4))
            return DebugUtils::errored(kErrorInvalidBroadcast);

          if (ASMJIT_UNLIKELY(commonData->hasAvx512B64() && size != 8))
            return DebugUtils::errored(kErrorInvalidBroadcast);
        }
      }

      // Validate AVX-512 {sae} and {er}.
      if (options & (X86Inst::kOptionSAE | X86Inst::kOptionER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (options & X86Inst::kOptionER) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);

          // {er} is defined for scalar ops or vector ops using zmm (LL = 10). We
          // don't need any more bits in the instruction database to be able to
          // validate this, as each AVX512 instruction that has broadcast is vector
          // instruction (in this case we require zmm registers), otherwise it's a
          // scalar instruction, which is valid.
          if (commonData->hasAvx512B()) {
            // Supports broadcast, thus we require LL to be '10', which means there
            // have to be zmm registers used. We don't calculate LL here, but we know
            // that it would be '10' if there is at least one ZMM register used.

            // There is no 'ER' enabled instruction with less than two operands.
            ASMJIT_ASSERT(count >= 2);
            if (ASMJIT_UNLIKELY(!X86Reg::isZmm(operands[0]) && !X86Reg::isZmm(operands[1])))
              return DebugUtils::errored(kErrorInvalidEROrSAE);
          }
        }
        else {
          // {sae} doesn't have the same limitations as {er}, this is enough.
          if (ASMJIT_UNLIKELY(!commonData->hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNZ prefix. Otherwise the instruction is invalid.
      if ((options & kAvx512Options) || (options & (X86Inst::kOptionRep | X86Inst::kOptionRepnz)) == 0)
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  return kErrorOk;
}